

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsEval.c
# Opt level: O1

void AssignmentExpression_subeq_eval(JsAstNode *na,JsContext *context,JsValue *res)

{
  JsValue *pJVar1;
  JsValue *res_00;
  JsValue *v;
  undefined1 local_c0 [8];
  JsValue r6;
  JsValue r2;
  JsValue r3;
  JsValue r4;
  JsValue v0;
  JsValue r1;
  
  pJVar1 = (JsValue *)((long)&v0.u + 8);
  (*JsNodeClassEval[(*(JsAstNode **)(na + 1))->astClass])(*(JsAstNode **)(na + 1),context,pJVar1);
  res_00 = (JsValue *)((long)&r6.u + 8);
  JsGetValue(pJVar1,res_00);
  v = (JsValue *)((long)&r2.u + 8);
  (*JsNodeClassEval[((JsAstNode *)na[1].location)->astClass])((JsAstNode *)na[1].location,context,v)
  ;
  pJVar1 = (JsValue *)((long)&r3.u + 8);
  JsGetValue(v,pJVar1);
  JsToNumber(res_00,(JsValue *)((long)&r4.u + 8));
  JsToNumber(pJVar1,(JsValue *)local_c0);
  res->type = JS_NUMBER;
  (res->u).number = (double)v0._0_8_ - (double)r6._0_8_;
  JsPutValue((JsValue *)((long)&v0.u + 8),res,(JsValue *)((long)&r4.u + 8));
  return;
}

Assistant:

static void
AssignmentExpression_subeq_eval(na, context, res)
	struct JsAstNode *na; /* (struct JsAstAssignmentExpressionNode) */
	struct JsContext *context;
	struct JsValue *res;
{
	struct JsAstAssignmentExpressionNode *n = 
		CAST_NODE(na, JsAstAssignmentExpressionNode);
	struct JsValue r1, r2, r3, r4, v0;

	EVAL(n->lhs, context, &r1);
	JsGetValue( &r1, &r2);
	EVAL(n->expr, context, &r3);
	JsGetValue( &r3, &r4);
	AdditiveExpression_sub_common(&r2, &r4, context, res);
	JsPutValue( &r1, res,&v0);
}